

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

apx_error_t
compile_limit_values_uint32
          (apx_compiler_t *self,uint8_t limit_variant,uint32_t lower_limit,uint32_t upper_limit)

{
  adt_error_t error_code;
  apx_error_t aVar1;
  byte local_31;
  adt_error_t rc;
  uint8_t elem_size;
  uint8_t *p;
  uint8_t buf [8];
  apx_error_t retval;
  uint32_t upper_limit_local;
  uint32_t lower_limit_local;
  uint8_t limit_variant_local;
  apx_compiler_t *self_local;
  
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  local_31 = 0;
  if (limit_variant == '\x01') {
    local_31 = 1;
  }
  else if (limit_variant == '\x02') {
    local_31 = 2;
  }
  else if (limit_variant == '\x03') {
    local_31 = 4;
  }
  else {
    buf[0] = '\n';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
  }
  buf._4_4_ = upper_limit;
  packLE((uint8_t *)&p,lower_limit,local_31);
  packLE((uint8_t *)((long)&p + (long)(int)(uint)local_31),buf._4_4_,local_31);
  if (buf._0_4_ == 0) {
    error_code = adt_bytearray_append(self->program,(uint8_t *)&p,(uint)local_31 << 1);
    buf._0_4_ = convert_from_adt_to_apx_error(error_code);
  }
  aVar1._0_1_ = buf[0];
  aVar1._1_1_ = buf[1];
  aVar1._2_1_ = buf[2];
  aVar1._3_1_ = buf[3];
  return aVar1;
}

Assistant:

static apx_error_t compile_limit_values_uint32(apx_compiler_t* self, uint8_t limit_variant, uint32_t lower_limit, uint32_t upper_limit)
{
   apx_error_t retval = APX_NO_ERROR;
   uint8_t buf[UINT32_SIZE * 2];
   uint8_t* p = &buf[0];
   uint8_t elem_size = 0u;

   assert(sizeof(buf) == 8);
   switch (limit_variant)
   {
   case APX_VM_VARIANT_LIMIT_CHECK_U8:
      elem_size = UINT8_SIZE;
      break;
   case APX_VM_VARIANT_LIMIT_CHECK_U16:
      elem_size = UINT16_SIZE;
      break;
   case APX_VM_VARIANT_LIMIT_CHECK_U32:
      elem_size = UINT32_SIZE;
      break;
   default:
      retval = APX_UNSUPPORTED_ERROR;
   }
   packLE(p, lower_limit, elem_size);
   p += elem_size;
   packLE(p, upper_limit, elem_size);
   if (retval == APX_NO_ERROR)
   {
      adt_error_t rc = adt_bytearray_append(self->program, &buf[0], elem_size * 2);
      retval = convert_from_adt_to_apx_error(rc);
   }
   return retval;
}